

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void writeRuleText(FILE *out,rule *rp)

{
  symbol *psVar1;
  int local_2c;
  int k;
  symbol *sp;
  int j;
  rule *rp_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"%s ::=",rp->lhs->name);
  for (sp._4_4_ = 0; sp._4_4_ < rp->nrhs; sp._4_4_ = sp._4_4_ + 1) {
    psVar1 = rp->rhs[sp._4_4_];
    if (psVar1->type == MULTITERMINAL) {
      fprintf((FILE *)out," %s",(*psVar1->subsym)->name);
      for (local_2c = 1; local_2c < psVar1->nsubsym; local_2c = local_2c + 1) {
        fprintf((FILE *)out,"|%s",psVar1->subsym[local_2c]->name);
      }
    }
    else {
      fprintf((FILE *)out," %s",psVar1->name);
    }
  }
  return;
}

Assistant:

static void writeRuleText(FILE *out, struct rule *rp){
  int j;
  fprintf(out,"%s ::=", rp->lhs->name);
  for(j=0; j<rp->nrhs; j++){
    struct symbol *sp = rp->rhs[j];
    if( sp->type!=MULTITERMINAL ){
      fprintf(out," %s", sp->name);
    }else{
      int k;
      fprintf(out," %s", sp->subsym[0]->name);
      for(k=1; k<sp->nsubsym; k++){
        fprintf(out,"|%s",sp->subsym[k]->name);
      }
    }
  }
}